

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool __thiscall ON_3dmViewPosition::Write(ON_3dmViewPosition *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,(uint)(4 < iVar2));
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bMaximized);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_wnd_left);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_wnd_right);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_wnd_top);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_wnd_bottom);
    }
    if ((4 < iVar2) && (bVar1 != false)) {
      bVar1 = ON_BinaryArchive::WriteChar(file,this->m_floating_viewport);
      return bVar1;
    }
  }
  return bVar1;
}

Assistant:

bool ON_3dmViewPosition::Write( ON_BinaryArchive& file ) const
{
  int minor_version =  ( file.Archive3dmVersion() >= 5 ) ? 1 : 0;

  bool rc = file.Write3dmChunkVersion(1,minor_version);
  if (rc) 
  {
    int i = m_bMaximized ? 1 : 0;
    if (rc) rc = file.WriteInt( i );
    if (rc) rc = file.WriteDouble( m_wnd_left );
    if (rc) rc = file.WriteDouble( m_wnd_right );
    if (rc) rc = file.WriteDouble( m_wnd_top );
    if (rc) rc = file.WriteDouble( m_wnd_bottom );

    if ( minor_version >= 1 )
    {
      // 13 March 2009 S. Baer
      // version 1.1 added support for m_floating_viewport
      // in V5 files.  This info is not in V4 files because
      // they might use this to write userdata.
      if (rc) rc = file.WriteChar( m_floating_viewport );
    }
  }
  return rc;
}